

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O1

void Lsp_Az(tetra_codec *st,Word16 *lsp,Word16 *a)

{
  uint uVar1;
  ulong uVar2;
  short *psVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  Word32 f2 [6];
  Word32 f1 [6];
  uint auStack_60 [8];
  uint auStack_40 [8];
  
  auStack_60[0] = 0x10842c;
  auStack_60[1] = 0;
  Get_Lsp_Pol(st,lsp,(Word32 *)(auStack_40 + 2));
  auStack_60[0] = 0x10843e;
  auStack_60[1] = 0;
  Get_Lsp_Pol(st,lsp + 1,(Word32 *)(auStack_60 + 2));
  uVar2 = 6;
  do {
    uVar6 = auStack_40[uVar2 + 1];
    uVar4 = auStack_40[uVar2] + uVar6;
    if ((-1 < (int)(auStack_40[uVar2] ^ uVar6)) && ((int)(uVar4 ^ uVar6) < 0)) {
      uVar4 = 0x7fffffff - ((int)uVar6 >> 0x1f);
      st->Overflow = 1;
    }
    auStack_40[uVar2 + 1] = uVar4;
    uVar4 = auStack_60[uVar2 + 1];
    uVar6 = uVar4 - auStack_60[uVar2];
    if (((int)(auStack_60[uVar2] ^ uVar4) < 0) && ((int)(uVar6 ^ uVar4) < 0)) {
      uVar6 = 0x7fffffff - ((int)uVar4 >> 0x1f);
      st->Overflow = 1;
    }
    auStack_60[uVar2 + 1] = uVar6;
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  *a = 0x1000;
  psVar3 = a + 10;
  lVar5 = 0;
  do {
    uVar6 = *(uint *)((long)auStack_40 + lVar5 * 2 + 0xc);
    uVar1 = *(uint *)((long)auStack_60 + lVar5 * 2 + 0xc);
    uVar4 = uVar1 + uVar6;
    if ((-1 < (int)(uVar1 ^ uVar6)) && ((int)(uVar4 ^ uVar6) < 0)) {
      uVar4 = 0x7fffffff - ((int)uVar6 >> 0x1f);
      st->Overflow = 1;
    }
    *(ushort *)((long)a + lVar5 + 2) = (short)(uVar4 >> 0xd) + (ushort)((uVar4 >> 0xc & 1) != 0);
    uVar4 = uVar6 - uVar1;
    if (((int)(uVar1 ^ uVar6) < 0) && ((int)(uVar4 ^ uVar6) < 0)) {
      uVar4 = 0x7fffffff - ((int)uVar6 >> 0x1f);
      st->Overflow = 1;
    }
    *psVar3 = (short)(uVar4 >> 0xd) + (ushort)((uVar4 >> 0xc & 1) != 0);
    psVar3 = psVar3 + -1;
    lVar5 = lVar5 + 2;
  } while (lVar5 != 10);
  return;
}

Assistant:

void Lsp_Az(tetra_codec* st, Word16 lsp[], Word16 a[])
{
  Word16 i, j;
  Word32 f1[6], f2[6];
  Word32 t0;

  Get_Lsp_Pol(st, &lsp[0],f1);
  Get_Lsp_Pol(st, &lsp[1],f2);

  for (i = 5; i > 0; i--)
  {
    f1[i] = L_add(st, f1[i], f1[i-1]);			/* f1[i] += f1[i-1]; */
    f2[i] = L_sub(st, f2[i], f2[i-1]);			/* f2[i] -= f2[i-1]; */
  }

  a[0] = 4096;
  for (i = 1, j = 10; i <= 5; i++, j--)
  {
    t0   = L_add(st, f1[i], f2[i]);			/* f1[i] + f2[i] */
    a[i] = extract_l( L_shr_r(st, t0,(Word16)13) );	/*from Q24 to Q12 and * 0.5*/
    t0   = L_sub(st, f1[i], f2[i]);			/* f1[i] - f2[i] */
    a[j] = extract_l( L_shr_r(st, t0,(Word16)13) );	/*from Q24 to Q12 and * 0.5*/
  }

  return;
}